

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

Padding * absl::lts_20250127::str_format_internal::anon_unknown_0::ExtraWidthToPadding
                    (Padding *__return_storage_ptr__,size_t total_size,FormatState *state)

{
  Flags FVar1;
  ulong uVar2;
  size_t sVar3;
  
  uVar2 = (ulong)state->conv->width_;
  if (((long)uVar2 < 0) || (sVar3 = uVar2 - total_size, uVar2 < total_size || sVar3 == 0)) {
    __return_storage_ptr__->left_spaces = 0;
    __return_storage_ptr__->zeros = 0;
  }
  else {
    FVar1 = state->conv->flags_;
    if ((FVar1 & kLeft) != kBasic) {
      __return_storage_ptr__->left_spaces = 0;
      __return_storage_ptr__->zeros = 0;
      __return_storage_ptr__->right_spaces = sVar3;
      return __return_storage_ptr__;
    }
    if ((FVar1 & kZero) == kBasic) {
      __return_storage_ptr__->left_spaces = sVar3;
      __return_storage_ptr__->zeros = 0;
      __return_storage_ptr__->right_spaces = 0;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->left_spaces = 0;
    __return_storage_ptr__->zeros = sVar3;
  }
  __return_storage_ptr__->right_spaces = 0;
  return __return_storage_ptr__;
}

Assistant:

Padding ExtraWidthToPadding(size_t total_size, const FormatState &state) {
  if (state.conv.width() < 0 ||
      static_cast<size_t>(state.conv.width()) <= total_size) {
    return {0, 0, 0};
  }
  size_t missing_chars = static_cast<size_t>(state.conv.width()) - total_size;
  if (state.conv.has_left_flag()) {
    return {0, 0, missing_chars};
  } else if (state.conv.has_zero_flag()) {
    return {0, missing_chars, 0};
  } else {
    return {missing_chars, 0, 0};
  }
}